

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

AdvanceClock * __thiscall
soul::PoolAllocator::allocate<soul::heart::AdvanceClock,soul::CodeLocation>
          (PoolAllocator *this,CodeLocation *args)

{
  PoolItem *pPVar1;
  CodeLocation local_28;
  
  pPVar1 = allocateSpaceForObject(this,0x20);
  local_28.sourceCode.object = (args->sourceCode).object;
  local_28.location.data = (args->location).data;
  (args->sourceCode).object = (SourceCodeText *)0x0;
  heart::AdvanceClock::AdvanceClock((AdvanceClock *)&pPVar1->item,&local_28);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_28.sourceCode);
  pPVar1->destructor =
       allocate<soul::heart::AdvanceClock,_soul::CodeLocation>::anon_class_1_0_00000001::__invoke;
  return (AdvanceClock *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }